

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy>::
initialize_quantization_lut
          (jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy>
           *this)

{
  pointer pcVar1;
  int8_t iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  jpegls_pc_parameters presets;
  
  if (((((this->traits_).near_lossless == 0) &&
       (uVar3 = (this->traits_).maximum_sample_value,
       (-1 << ((byte)(this->traits_).bits_per_pixel & 0x1f) ^ uVar3) == 0xffffffff)) &&
      (compute_default(&presets,uVar3,0), presets.threshold1 == this->t1_)) &&
     (((presets.threshold2 == this->t2_ && (presets.threshold3 == this->t3_)) &&
      ((uVar3 = (this->traits_).bits_per_pixel - 8, uVar3 < 9 &&
       ((0x115U >> (uVar3 & 0x1f) & 1) != 0)))))) {
    this->quantization_ =
         (int8_t *)
         (((ulong)(*(long *)(&PTR_DAT_0013fcf0)[uVar3] -
                  *(long *)(&PTR_quantization_lut_lossless_8_0013fd38)[uVar3]) >> 1) +
         *(long *)(&PTR_quantization_lut_lossless_8_0013fd38)[uVar3]);
    return;
  }
  iVar4 = 1 << ((byte)(this->traits_).bits_per_pixel & 0x1f);
  std::vector<signed_char,_std::allocator<signed_char>_>::resize
            (&this->quantization_lut_,(long)iVar4 * 2);
  for (uVar5 = 0;
      pcVar1 = (this->quantization_lut_).
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->quantization_lut_).
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pcVar1); uVar5 = uVar5 + 1) {
    iVar2 = quantize_gradient_org(this,(int)uVar5 - iVar4);
    (this->quantization_lut_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start[uVar5] = iVar2;
  }
  this->quantization_ = pcVar1 + iVar4;
  return;
}

Assistant:

void initialize_quantization_lut()
    {
        // for lossless mode with default parameters, we have precomputed the look up table for bit counts 8, 10, 12 and 16.
        if (traits_.near_lossless == 0 && traits_.maximum_sample_value == (1 << traits_.bits_per_pixel) - 1)
        {
            const jpegls_pc_parameters presets{compute_default(traits_.maximum_sample_value, traits_.near_lossless)};
            if (presets.threshold1 == t1_ && presets.threshold2 == t2_ && presets.threshold3 == t3_)
            {
                if (traits_.bits_per_pixel == 8)
                {
                    quantization_ = &quantization_lut_lossless_8[quantization_lut_lossless_8.size() / 2];
                    return;
                }
                if (traits_.bits_per_pixel == 10)
                {
                    quantization_ = &quantization_lut_lossless_10[quantization_lut_lossless_10.size() / 2];
                    return;
                }
                if (traits_.bits_per_pixel == 12)
                {
                    quantization_ = &quantization_lut_lossless_12[quantization_lut_lossless_12.size() / 2];
                    return;
                }
                if (traits_.bits_per_pixel == 16)
                {
                    quantization_ = &quantization_lut_lossless_16[quantization_lut_lossless_16.size() / 2];
                    return;
                }
            }
        }

        // Initialize the quantization lookup table dynamic.
        const int32_t range{1 << traits_.bits_per_pixel};
        quantization_lut_.resize(static_cast<size_t>(range) * 2);
        for (size_t i{}; i < quantization_lut_.size(); ++i)
        {
            quantization_lut_[i] = quantize_gradient_org(-range + static_cast<int32_t>(i));
        }

        quantization_ = &quantization_lut_[range];
    }